

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_868a0::data<float>::setUpFrameBuffer
          (data<float> *this,vector<float,_std::allocator<float>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Slice *pSVar4;
  int iVar5;
  pointer pbVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  pointer pbVar10;
  ulong uVar11;
  Slice local_68 [56];
  
  iVar5 = (dw->max).x;
  iVar1 = (dw->min).x;
  iVar2 = (dw->max).y;
  iVar3 = (dw->min).y;
  lVar9 = (long)((iVar5 - iVar1) + 1);
  if (iVar2 < iVar3 || iVar5 < iVar1) {
    lVar9 = 1;
  }
  lVar8 = (long)((iVar2 - iVar3) + 1);
  if (iVar2 < iVar3 || iVar5 < iVar1) {
    lVar8 = 1;
  }
  std::vector<float,_std::allocator<float>_>::resize
            (data,lVar9 * ((long)(this->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5) * lVar8);
  pbVar10 = (this->_channels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar10) {
    uVar11 = 0;
    do {
      if (dontbotherloadingdepth) {
        iVar5 = std::__cxx11::string::compare((char *)(pbVar10 + uVar11));
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare
                            ((char *)((this->_channels).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar11));
          if (iVar5 != 0) {
            pbVar10 = (this->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar6 = (this->_channels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_00138e33;
          }
        }
      }
      else {
LAB_00138e33:
        iVar1 = (dw->min).x;
        iVar2 = (dw->min).y;
        iVar3 = (dw->max).x;
        pSVar4 = (Slice *)pbVar10[uVar11]._M_dataplus._M_p;
        iVar5 = (iVar3 - iVar1) + 1;
        if ((dw->max).y < iVar2) {
          iVar5 = 1;
        }
        if (iVar3 < iVar1) {
          iVar5 = 1;
        }
        uVar7 = (long)pbVar6 - (long)pbVar10 >> 3;
        Imf_3_4::Slice::Slice
                  (local_68,this->_type,
                   (char *)((long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                  super__Vector_impl_data._M_start +
                           (uVar11 * 4 - (long)(iVar2 * iVar5 + iVar1) * uVar7)),uVar7,
                   (long)iVar5 * ((long)pbVar6 - (long)pbVar10 >> 5) * 4,1,1,0.0,false,false);
        Imf_3_4::FrameBuffer::insert((char *)framebuf,pSVar4);
      }
      uVar11 = uVar11 + 1;
      pbVar10 = (this->_channels).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = (this->_channels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar11 < (ulong)((long)pbVar6 - (long)pbVar10 >> 5));
  }
  return;
}

Assistant:

void setUpFrameBuffer (
        vector<T>&   data,
        FrameBuffer& framebuf,
        const Box2i& dw,
        bool         dontbotherloadingdepth) const
    {

        // allocate enough space for all channels (even the depth channel)
        data.resize (
            _channels.size () * (dw.size ().x + 1) * (dw.size ().y + 1));
        for (size_t i = 0; i < _channels.size (); i++)
        {
            if (!dontbotherloadingdepth ||
                (_channels[i] != "Z" && _channels[i] != "ZBack"))
            {
                intptr_t base = reinterpret_cast<intptr_t> (&data[i]);
                framebuf.insert (
                    _channels[i].c_str (),
                    Slice (
                        _type,
                        reinterpret_cast<char*> (
                            base -
                            sizeof (T) *
                                (dw.min.x + dw.min.y * (dw.size ().x + 1)) *
                                _channels.size ()),
                        sizeof (T) * _channels.size (),
                        sizeof (T) * (dw.size ().x + 1) * _channels.size ()));
            }
        }
    }